

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doPrintDefinition(DerivedFunc<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                    *this,ostream *os)

{
  ParamNames *pPVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  SharedPtr<const_vkt::shaderexecutor::Statement> *this_00;
  Statement *stmt;
  ExprBase *expr;
  ulong local_58;
  size_t ndx;
  string local_40 [32];
  ParamNames *local_20;
  ParamNames *paramNames;
  ostream *os_local;
  DerivedFunc<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  paramNames = (ParamNames *)os;
  os_local = (ostream *)this;
  local_20 = Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,2,2>,tcu::Matrix<float,2,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
             ::getParamNames_abi_cxx11_
                       ((Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,2,2>,tcu::Matrix<float,2,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
                         *)this);
  initialize(this);
  pPVar1 = paramNames;
  pcVar3 = dataTypeNameOf<tcu::Matrix<float,2,2>>();
  poVar4 = std::operator<<((ostream *)pPVar1,pcVar3);
  poVar4 = std::operator<<(poVar4," ");
  (*(this->
    super_Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ).super_FuncBase._vptr_FuncBase[2])();
  poVar4 = std::operator<<(poVar4,local_40);
  std::operator<<(poVar4,"(");
  std::__cxx11::string::~string(local_40);
  bVar2 = isTypeValid<tcu::Matrix<float,2,2>>();
  pPVar1 = paramNames;
  if (bVar2) {
    pcVar3 = dataTypeNameOf<tcu::Matrix<float,2,2>>();
    poVar4 = std::operator<<((ostream *)pPVar1,pcVar3);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,(string *)local_20);
  }
  bVar2 = isTypeValid<vkt::shaderexecutor::Void>();
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)paramNames,", ");
    pcVar3 = dataTypeNameOf<vkt::shaderexecutor::Void>();
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,(string *)&local_20->b);
  }
  bVar2 = isTypeValid<vkt::shaderexecutor::Void>();
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)paramNames,", ");
    pcVar3 = dataTypeNameOf<vkt::shaderexecutor::Void>();
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,(string *)&local_20->c);
  }
  bVar2 = isTypeValid<vkt::shaderexecutor::Void>();
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)paramNames,", ");
    pcVar3 = dataTypeNameOf<vkt::shaderexecutor::Void>();
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4," ");
    std::operator<<(poVar4,(string *)&local_20->d);
  }
  std::operator<<((ostream *)paramNames,")\n{\n");
  for (local_58 = 0;
      sVar5 = std::
              vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ::size(&this->m_body), pPVar1 = paramNames, local_58 < sVar5; local_58 = local_58 + 1)
  {
    this_00 = &std::
               vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
               ::operator[](&this->m_body,local_58)->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>;
    stmt = de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator*(this_00);
    shaderexecutor::operator<<((ostream *)pPVar1,stmt);
  }
  poVar4 = std::operator<<((ostream *)paramNames,"return ");
  expr = &de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>::operator*
                    ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_> *)
                     &this->m_ret)->super_ExprBase;
  poVar4 = shaderexecutor::operator<<(poVar4,expr);
  std::operator<<(poVar4,";\n");
  std::operator<<((ostream *)paramNames,"}\n");
  return;
}

Assistant:

void						doPrintDefinition	(ostream& os) const
	{
		const ParamNames&	paramNames	= this->getParamNames();

		initialize();

		os << dataTypeNameOf<Ret>() << " " << this->getName()
			<< "(";
		if (isTypeValid<Arg0>())
			os << dataTypeNameOf<Arg0>() << " " << paramNames.a;
		if (isTypeValid<Arg1>())
			os << ", " << dataTypeNameOf<Arg1>() << " " << paramNames.b;
		if (isTypeValid<Arg2>())
			os << ", " << dataTypeNameOf<Arg2>() << " " << paramNames.c;
		if (isTypeValid<Arg3>())
			os << ", " << dataTypeNameOf<Arg3>() << " " << paramNames.d;
		os << ")\n{\n";

		for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
			os << *m_body[ndx];
		os << "return " << *m_ret << ";\n";
		os << "}\n";
	}